

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

_Bool ec_nist_alg_and_curve_by_bits(int bits,ec_curve **curve,ssh_keyalg **alg)

{
  ec_curve *peVar1;
  ssh_keyalg **alg_local;
  ec_curve **curve_local;
  int bits_local;
  
  if (bits == 0x100) {
    *alg = &ssh_ecdsa_nistp256;
  }
  else if (bits == 0x180) {
    *alg = &ssh_ecdsa_nistp384;
  }
  else {
    if (bits != 0x209) {
      return false;
    }
    *alg = &ssh_ecdsa_nistp521;
  }
  peVar1 = (ec_curve *)(**(*alg)->extra)();
  *curve = peVar1;
  return true;
}

Assistant:

bool ec_nist_alg_and_curve_by_bits(
    int bits, const struct ec_curve **curve, const ssh_keyalg **alg)
{
    switch (bits) {
      case 256: *alg = &ssh_ecdsa_nistp256; break;
      case 384: *alg = &ssh_ecdsa_nistp384; break;
      case 521: *alg = &ssh_ecdsa_nistp521; break;
      default: return false;
    }
    *curve = ((struct ecsign_extra *)(*alg)->extra)->curve();
    return true;
}